

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall Node::OutputBlock(Node *this,ostream *os)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  iVar2 = 0;
  if (0 < Level) {
    iVar2 = Level;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)iVar2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  Level = Level + 1;
  iVar2 = CompileFlag;
  do {
    if ((this->FromInclude == 0) || (bVar3 = iVar2 != 0, iVar2 = 0, bVar3)) {
      OutputCodeOne(this,os);
      iVar2 = CompileFlag;
    }
    this = this->Block[0];
  } while (this != (Node *)0x0);
  Level = Level + -1;
  iVar2 = 0;
  if (0 < Level) {
    iVar2 = Level;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)iVar2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void Node::OutputBlock(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	//
	// If this is a 0 bit of code, just output a semicolon
	//
	if (this == 0)
	{
		os << Indent() << ";" << std::endl;
	}
	else
	{
		//
		// Start the block
		//
		os << Indent() << "{" << std::endl;

		Level++;

		//
		// Local Variables
		//
		Node *Program = this;

		//
		// Starting at the top node, we scan down handling each
		// level 0 node type as necessary.
		//
		// Could do this by calling OutputCode recursively for the Down
		// level instead of splitting into OutputCode and OutputCodeOne,
		// but that would probibly consume too much stack space.
		//
		while (Program != 0)
		{
			//
			// Handle Statement
			//
			if ((Program->FromInclude == 0) || (CompileFlag != 0))
			{
				Program->OutputCodeOne(os);
			}

			//
			// Get next node
			//
			Program = Program->Block[0];
		}

		//
		// End the block
		//
		Level--;
		os << Indent() << "}" << std::endl;
	}
}